

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<double>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Vec3<double>_> *this,IStream *is,int size,int version)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  IStream *in_RSI;
  
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_RSI,(double *)CONCAT44(in_EDX,in_ECX));
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_RSI,(double *)CONCAT44(in_EDX,in_ECX));
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_RSI,(double *)CONCAT44(in_EDX,in_ECX));
  return;
}

Assistant:

void
V3dAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.x);
    Xdr::read <StreamIO> (is, _value.y);
    Xdr::read <StreamIO> (is, _value.z);
}